

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

shared_ptr<Camera> __thiscall
Camera::Create(Camera *this,shared_ptr<myvk::Device> *device,uint32_t frame_count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  DescriptorSet *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  element_type *peVar5;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long lVar8;
  ulong __n;
  shared_ptr<Camera> sVar9;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  allocator_type local_89;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_88;
  Camera *local_70;
  undefined1 local_68 [36];
  uint32_t uStack_44;
  element_type *peStack_40;
  
  (this->m_position).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (this->m_position).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  puVar6 = (undefined8 *)operator_new(0x98);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_0032c690;
  memset(puVar6 + 2,0,0x88);
  *(undefined8 *)((long)puVar6 + 0x24) = 0x3fe38e393f860a92;
  *(undefined8 *)((long)puVar6 + 0x2c) = 0x3d8000003ba3d70a;
  puVar6[7] = 0;
  puVar6[8] = 0;
  puVar6[9] = 0;
  puVar6[10] = 0;
  puVar6[0xb] = 0;
  puVar6[0xc] = 0;
  puVar6[0xd] = 0;
  puVar6[0xe] = 0;
  puVar6[0xf] = 0;
  puVar6[0x10] = 0;
  puVar6[0x11] = 0;
  puVar6[0x12] = 0;
  *(undefined8 **)&(this->m_position).field_2 = puVar6;
  *(undefined8 **)&this->m_position = puVar6 + 2;
  uStack_44 = frame_count;
  local_68._32_4_ = 6;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_68 + 0x20);
  local_70 = this;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (&local_88,__l,&local_89);
  myvk::DescriptorPool::Create((DescriptorPool *)local_68,device,frame_count,&local_88);
  uVar4 = local_68._8_8_;
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[10];
  puVar6[9] = uVar3;
  puVar6[10] = uVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if (local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_68._0_8_ = (pointer)0x600000000;
  local_68._8_8_ = (element_type *)0x3000000001;
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_68;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             &local_88,__l_00,(allocator_type *)&local_89);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)(local_68 + 0x20),device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             &local_88);
  peVar5 = peStack_40;
  _Var7._M_pi = stack0xffffffffffffffb8;
  stack0xffffffffffffffb8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_40 = (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[0xc];
  puVar6[0xb] = _Var7._M_pi;
  puVar6[0xc] = peVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (peStack_40 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_40);
  }
  if (local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  __n = (ulong)frame_count;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)(local_68 + 0x20),__n,(value_type *)(puVar6 + 0xb),(allocator_type *)&local_89);
  myvk::DescriptorSet::CreateMultiple
            ((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)local_68,(Ptr<DescriptorPool> *)(puVar6 + 9),
             (vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
              *)(local_68 + 0x20));
  local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar6[0x10];
  local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar6[0x11];
  local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)puVar6[0x12];
  puVar6[0x10] = local_68._0_8_;
  puVar6[0x11] = local_68._8_8_;
  puVar6[0x12] = local_68._16_8_;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (element_type *)0x0;
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_88);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)local_68);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)(local_68 + 0x20));
  std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
  resize((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_> *)
         (puVar6 + 0xd),__n);
  _Var7._M_pi = extraout_RDX;
  if (frame_count != 0) {
    lVar8 = 0;
    do {
      local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      myvk::Buffer::Create
                ((Buffer *)local_68,device,0x40,0x404,0x10,VMA_MEMORY_USAGE_AUTO,
                 (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                  *)&local_88);
      uVar4 = local_68._8_8_;
      uVar3 = local_68._0_8_;
      lVar2 = *(long *)&local_70->m_position;
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (element_type *)0x0;
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (*(long *)(lVar2 + 0x58) + 8 + lVar8);
      puVar6 = (undefined8 *)(*(long *)(lVar2 + 0x58) + lVar8);
      *puVar6 = uVar3;
      puVar6[1] = uVar4;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)&local_88);
      this_00 = *(DescriptorSet **)(*(long *)(lVar2 + 0x70) + lVar8);
      local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(*(long *)(lVar2 + 0x58) + lVar8);
      local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_finish = *(pointer *)(*(long *)(lVar2 + 0x58) + 8 + lVar8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
               _M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
               _M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      myvk::DescriptorSet::UpdateUniformBuffer
                (this_00,(Ptr<BufferBase> *)&local_88,0,0,0,0xffffffffffffffff);
      _Var7._M_pi = extraout_RDX_00;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_88.super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88.
                   super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        _Var7._M_pi = extraout_RDX_01;
      }
      lVar8 = lVar8 + 0x10;
    } while (__n << 4 != lVar8);
  }
  sVar9.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar9.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_70;
  return (shared_ptr<Camera>)sVar9.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Camera> Camera::Create(const std::shared_ptr<myvk::Device> &device, uint32_t frame_count) {
	std::shared_ptr<Camera> ret = std::make_shared<Camera>();
	ret->m_descriptor_pool =
	    myvk::DescriptorPool::Create(device, frame_count, {{VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, frame_count}});
	{
		VkDescriptorSetLayoutBinding camera_binding = {};
		camera_binding.binding = 0;
		camera_binding.descriptorType = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
		camera_binding.descriptorCount = 1;
		camera_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		ret->m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {camera_binding});
	}

	ret->m_descriptor_sets = myvk::DescriptorSet::CreateMultiple(
	    ret->m_descriptor_pool,
	    std::vector<std::shared_ptr<myvk::DescriptorSetLayout>>(frame_count, ret->m_descriptor_set_layout));
	ret->m_uniform_buffers.resize(frame_count);

	for (uint32_t i = 0; i < frame_count; ++i) {
		ret->m_uniform_buffers[i] = myvk::Buffer::Create(device, sizeof(UniformData),
		                                                 VMA_ALLOCATION_CREATE_MAPPED_BIT |
		                                                     VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		                                                 VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
		ret->m_descriptor_sets[i]->UpdateUniformBuffer(ret->m_uniform_buffers[i], 0);
	}

	return ret;
}